

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.c
# Opt level: O2

Integer ma_table_allocate(TableData data)

{
  Integer IVar1;
  Integer IVar2;
  Table pTVar3;
  Table __dest;
  TableEntryState *pTVar4;
  long lVar5;
  long lVar6;
  Integer IVar7;
  ulong __size;
  bool bVar8;
  
  IVar2 = ma_table_capacity;
  IVar1 = ma_table_entries;
  if (ma_table_capacity <= ma_table_entries) {
    lVar6 = 0x20;
    if (ma_table_capacity != 0) {
      lVar6 = ma_table_capacity * 2;
    }
    __size = (ulong)(uint)((int)lVar6 << 4);
    __dest = (Table)malloc(__size);
    pTVar3 = ma_table;
    if (__dest == (Table)0x0) {
      sprintf(ma_ebuf,"could not allocate %u bytes for ma_table",__size);
      goto LAB_00178326;
    }
    if (0 < IVar2) {
      memcpy(__dest,ma_table,(long)((int)IVar2 << 4));
      free(pTVar3);
    }
    pTVar4 = &__dest[lVar6 + -1].state;
    for (lVar5 = lVar6; IVar2 < lVar5; lVar5 = lVar5 + -1) {
      *pTVar4 = TES_Unused;
      pTVar4 = pTVar4 + -4;
    }
    ma_table_next_slot = IVar2;
    ma_table_capacity = lVar6;
    ma_table = __dest;
  }
  pTVar3 = ma_table;
  IVar2 = ma_table_capacity;
  lVar6 = 0;
  IVar7 = ma_table_next_slot;
  if (0 < ma_table_capacity) {
    lVar6 = ma_table_capacity;
  }
  while (bVar8 = lVar6 != 0, lVar6 = lVar6 + -1, bVar8) {
    if (ma_table[IVar7].state != TES_Allocated) {
      ma_table[IVar7].data = data;
      pTVar3[IVar7].state = TES_Allocated;
      ma_table_entries = IVar1 + 1;
      ma_table_next_slot = (IVar7 + 1) % IVar2;
      return IVar7;
    }
    IVar7 = (IVar7 + 1) % ma_table_capacity;
  }
  sprintf(ma_ebuf,"no ma_table slot available, %ld/%ld slots used",IVar1,ma_table_capacity);
LAB_00178326:
  ma_error(EL_Nonfatal,ET_Internal,"ma_table_allocate",ma_ebuf);
  return -1;
}

Assistant:

public Integer ma_table_allocate(data)
    TableData    data;        /* to store */
{
    Table    new_ma_table;
    Integer    new_ma_table_capacity;
    unsigned    new_ma_table_size;
    Integer    i;
    Integer    slots_examined;

    /* expand the table if necessary */
    if (ma_table_entries >= ma_table_capacity)
    {
        /* increase table capacity */
        if (ma_table_capacity == 0)
            /* set the initial capacity */
            new_ma_table_capacity = DEFAULT_TABLE_ENTRIES;
        else
            /* double the current capacity */
            new_ma_table_capacity = 2 * ma_table_capacity;

        /* allocate space for new table */
        new_ma_table_size = (unsigned)(new_ma_table_capacity * sizeof(TableEntry));
        if ((new_ma_table = (Table)bytealloc(new_ma_table_size)) == (Table)NULL)
        {
            (void)sprintf(ma_ebuf,
                "could not allocate %u bytes for ma_table",
                new_ma_table_size);
            ma_error(EL_Nonfatal, ET_Internal, "ma_table_allocate", ma_ebuf);
            return TABLE_HANDLE_NONE;
        }

        /* copy and free old table */
        if (ma_table_capacity > 0)
        {
            bytecopy(ma_table, new_ma_table, (ma_table_capacity * sizeof(TableEntry)));
            bytefree(ma_table);
        }

        /* initialize new part of new table */
        for (i = new_ma_table_capacity-1; i >= ma_table_capacity; i--)
            new_ma_table[i].state = TES_Unused;

        /* remember the new table */
        ma_table = new_ma_table;
        ma_table_next_slot = ma_table_capacity;
        ma_table_capacity = new_ma_table_capacity;
    }

    /* perform a linear circular search to find the next available slot */
    for (slots_examined = 0, i = ma_table_next_slot;
         slots_examined < ma_table_capacity;
         slots_examined++, i = (i+1) % ma_table_capacity)
    {
        if (ma_table[i].state != TES_Allocated)
        {
            /* store the data */
            ma_table[i].data = data;
            ma_table[i].state = TES_Allocated;

            /* increment ma_table_entries */
            ma_table_entries++;

            /* advance ma_table_next_slot */
            ma_table_next_slot = (i+1) % ma_table_capacity;

            /* return the handle */
            return i;
        }
    }

    /* if we get here, something is wrong */
    (void)sprintf(ma_ebuf,
        "no ma_table slot available, %ld/%ld slots used",
        (long)ma_table_entries, (long)ma_table_capacity);
    ma_error(EL_Nonfatal, ET_Internal, "ma_table_allocate", ma_ebuf);
    return TABLE_HANDLE_NONE;
}